

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzlib.c
# Opt level: O1

void gz_error(gz_statep state,int err,char *msg)

{
  char *__s;
  size_t sVar1;
  size_t sVar2;
  char *__dest;
  
  if (state->msg != (char *)0x0) {
    if (state->err != -4) {
      free(state->msg);
    }
    state->msg = (char *)0x0;
  }
  state->err = err;
  if (msg != (char *)0x0) {
    if (err == -4) {
      state->msg = msg;
    }
    else {
      __s = state->path;
      sVar1 = strlen(__s);
      sVar2 = strlen(msg);
      __dest = (char *)malloc(sVar1 + sVar2 + 3);
      state->msg = __dest;
      if (__dest != (char *)0x0) {
        strcpy(__dest,__s);
        sVar1 = strlen(__dest);
        (__dest + sVar1)[0] = ':';
        (__dest + sVar1)[1] = ' ';
        __dest[sVar1 + 2] = '\0';
        strcat(__dest,msg);
        return;
      }
      state->err = -4;
      state->msg = "out of memory";
    }
  }
  return;
}

Assistant:

void ZLIB_INTERNAL gz_error(gz_statep state, int err, const char *msg)
{
    /* free previously allocated message and clear */
    if (state->msg != NULL) {
        if (state->err != Z_MEM_ERROR)
            free(state->msg);
        state->msg = NULL;
    }

    /* set error code, and if no message, then done */
    state->err = err;
    if (msg == NULL)
        return;

    /* for an out of memory error, save as static string */
    if (err == Z_MEM_ERROR) {
        state->msg = (char *)msg;
        return;
    }

    /* construct error message with path */
    if ((state->msg = (char *)malloc(strlen(state->path) + strlen(msg) + 3)) == NULL) {
        state->err = Z_MEM_ERROR;
        state->msg = (char *)"out of memory";
        return;
    }
    strcpy(state->msg, state->path);
    strcat(state->msg, ": ");
    strcat(state->msg, msg);
    return;
}